

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O2

unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
FastPForLib::fastpfor256_codec(void)

{
  CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte> *this;
  __uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
  in_RDI;
  
  this = (CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte> *)operator_new(0x88);
  CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte>::CompositeCodec(this);
  *(CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte> **)
   in_RDI.
   super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
   ._M_t.
   super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
   .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
          )(tuple<FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>)
           in_RDI.
           super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
           ._M_t.
           super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
           .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IntegerCODEC> fastpfor256_codec() {
  return make_unique<CompositeCodec<FastPFor<8>, VariableByte>>();
}